

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int vm_builtin_is_callable(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  anon_union_8_3_18420de5_for_x aVar1;
  jx9_value *pObj;
  
  if (nArg < 1) {
    pObj = pCtx->pRet;
    jx9MemObjRelease(pObj);
    (pObj->x).rVal = 0.0;
  }
  else {
    aVar1._0_4_ = jx9VmIsCallable(pCtx->pVm,*apArg);
    pObj = pCtx->pRet;
    jx9MemObjRelease(pObj);
    aVar1.iVal._4_4_ = 0;
    pObj->x = aVar1;
  }
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int vm_builtin_is_callable(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_vm *pVm;	
	int res;
	if( nArg < 1 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return SXRET_OK;
	}
	/* Point to the target VM */
	pVm = pCtx->pVm;
	/* Perform the requested operation */
	res = jx9VmIsCallable(pVm, apArg[0]);
	jx9_result_bool(pCtx, res);
	return SXRET_OK;
}